

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleRPathChangeCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  bool bVar3;
  cmSystemToolsFileTime *t;
  ostream *poVar4;
  int iVar5;
  ulong uVar6;
  bool changed;
  cmCommand *local_228;
  allocator<char> local_21a;
  allocator<char> local_219;
  string emsg;
  char *local_1f8;
  char *local_1f0;
  string file;
  string local_1c8;
  ostringstream e;
  
  file._M_dataplus._M_p = (pointer)&file.field_2;
  file._M_string_length = 0;
  file.field_2._M_local_buf[0] = '\0';
  local_1f8 = (char *)0x0;
  iVar5 = 0;
  local_1f0 = (char *)0x0;
  uVar6 = 1;
  local_228 = &this->super_cmCommand;
  for (; pbVar1 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
      uVar6 < (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar6 = (ulong)((int)uVar6 + 1)) {
    bVar2 = std::operator==(pbVar1 + uVar6,"OLD_RPATH");
    if (bVar2) {
      iVar5 = 2;
    }
    else {
      bVar2 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar6,"NEW_RPATH");
      if (bVar2) {
        iVar5 = 3;
      }
      else {
        bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar6,"FILE");
        if (bVar2) {
          iVar5 = 1;
        }
        else {
          if (iVar5 == 3) {
            local_1f8 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p;
          }
          else {
            if (iVar5 != 2) {
              if (iVar5 == 1) {
                iVar5 = 0;
                std::__cxx11::string::_M_assign((string *)&file);
                goto LAB_00245bad;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              poVar4 = std::operator<<((ostream *)&e,"RPATH_CHANGE given unknown argument ");
              std::operator<<(poVar4,(string *)
                                     ((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar6));
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(local_228,&emsg);
              goto LAB_00245fc5;
            }
            local_1f0 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar6]._M_dataplus._M_p;
          }
          iVar5 = 0;
        }
      }
    }
LAB_00245bad:
  }
  if (file._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"RPATH_CHANGE not given FILE option.",(allocator<char> *)&emsg);
    cmCommand::SetError(local_228,(string *)&e);
LAB_00245e05:
    std::__cxx11::string::~string((string *)&e);
  }
  else {
    if (local_1f0 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"RPATH_CHANGE not given OLD_RPATH option.",(allocator<char> *)&emsg);
      cmCommand::SetError(local_228,(string *)&e);
      goto LAB_00245e05;
    }
    if (local_1f8 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"RPATH_CHANGE not given NEW_RPATH option.",(allocator<char> *)&emsg);
      cmCommand::SetError(local_228,(string *)&e);
      goto LAB_00245e05;
    }
    bVar2 = cmsys::SystemTools::FileExists(&file,true);
    if (bVar2) {
      t = cmSystemTools::FileTimeNew();
      bVar2 = cmSystemTools::FileTimeGet(&file,t);
      emsg._M_dataplus._M_p = (pointer)&emsg.field_2;
      emsg._M_string_length = 0;
      emsg.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>((string *)&e,local_1f0,&local_219);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,local_1f8,&local_21a);
      bVar3 = cmSystemTools::ChangeRPath(&file,(string *)&e,&local_1c8,&emsg,&changed);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&e);
      if (bVar3) {
        if (changed == true) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"Set runtime path of \"",(allocator<char> *)&local_1c8);
          std::__cxx11::string::append((string *)&e);
          std::__cxx11::string::append((char *)&e);
          std::__cxx11::string::append((char *)&e);
          std::__cxx11::string::append((char *)&e);
          cmMakefile::DisplayStatus(local_228->Makefile,(string *)&e,-1.0);
          std::__cxx11::string::~string((string *)&e);
        }
        if (bVar2) {
          cmSystemTools::FileTimeSet(&file,t);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        poVar4 = std::operator<<((ostream *)&e,"RPATH_CHANGE could not write new RPATH:\n");
        poVar4 = std::operator<<(poVar4,"  ");
        poVar4 = std::operator<<(poVar4,local_1f8);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"to the file:\n");
        poVar4 = std::operator<<(poVar4,"  ");
        poVar4 = std::operator<<(poVar4,(string *)&file);
        poVar4 = std::operator<<(poVar4,"\n");
        std::operator<<(poVar4,(string *)&emsg);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(local_228,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
      cmSystemTools::FileTimeDelete(t);
      std::__cxx11::string::~string((string *)&emsg);
      goto LAB_00245e14;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar4 = std::operator<<((ostream *)&e,"RPATH_CHANGE given FILE \"");
    poVar4 = std::operator<<(poVar4,(string *)&file);
    std::operator<<(poVar4,"\" that does not exist.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(local_228,&emsg);
LAB_00245fc5:
    std::__cxx11::string::~string((string *)&emsg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  bVar3 = false;
LAB_00245e14:
  std::__cxx11::string::~string((string *)&file);
  return bVar3;
}

Assistant:

bool cmFileCommand::HandleRPathChangeCommand(
  std::vector<std::string> const& args)
{
  // Evaluate arguments.
  std::string file;
  const char* oldRPath = nullptr;
  const char* newRPath = nullptr;
  enum Doing
  {
    DoingNone,
    DoingFile,
    DoingOld,
    DoingNew
  };
  Doing doing = DoingNone;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (args[i] == "OLD_RPATH") {
      doing = DoingOld;
    } else if (args[i] == "NEW_RPATH") {
      doing = DoingNew;
    } else if (args[i] == "FILE") {
      doing = DoingFile;
    } else if (doing == DoingFile) {
      file = args[i];
      doing = DoingNone;
    } else if (doing == DoingOld) {
      oldRPath = args[i].c_str();
      doing = DoingNone;
    } else if (doing == DoingNew) {
      newRPath = args[i].c_str();
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "RPATH_CHANGE given unknown argument " << args[i];
      this->SetError(e.str());
      return false;
    }
  }
  if (file.empty()) {
    this->SetError("RPATH_CHANGE not given FILE option.");
    return false;
  }
  if (!oldRPath) {
    this->SetError("RPATH_CHANGE not given OLD_RPATH option.");
    return false;
  }
  if (!newRPath) {
    this->SetError("RPATH_CHANGE not given NEW_RPATH option.");
    return false;
  }
  if (!cmSystemTools::FileExists(file, true)) {
    std::ostringstream e;
    e << "RPATH_CHANGE given FILE \"" << file << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }
  bool success = true;
  cmSystemToolsFileTime* ft = cmSystemTools::FileTimeNew();
  bool have_ft = cmSystemTools::FileTimeGet(file, ft);
  std::string emsg;
  bool changed;
  if (!cmSystemTools::ChangeRPath(file, oldRPath, newRPath, &emsg, &changed)) {
    std::ostringstream e;
    /* clang-format off */
    e << "RPATH_CHANGE could not write new RPATH:\n"
      << "  " << newRPath << "\n"
      << "to the file:\n"
      << "  " << file << "\n"
      << emsg;
    /* clang-format on */
    this->SetError(e.str());
    success = false;
  }
  if (success) {
    if (changed) {
      std::string message = "Set runtime path of \"";
      message += file;
      message += "\" to \"";
      message += newRPath;
      message += "\"";
      this->Makefile->DisplayStatus(message, -1);
    }
    if (have_ft) {
      cmSystemTools::FileTimeSet(file, ft);
    }
  }
  cmSystemTools::FileTimeDelete(ft);
  return success;
}